

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O0

void zhangfei(dw_rom *rom)

{
  dw_rom *rom_local;
  
  doae(rom);
  vpatch(rom,0x1a8e,3,0x2b,0x37,6);
  set_player_palette(rom,'\x01');
  vpatch(rom,0x12260,0x40,0xe0,0xf0,0xe8,0x80,0xc0,0x40,0,0,0xe0,0xf0,0x48,0xe0,0xe0,0xe0,0xe0,0xe0,
         0xe0,0x20,0x20,0x20,0xe0,0xe0,0xe0,0,0xe0,0xc0,0xd8,0xf8,0,0xe0,0xe0,0xc0,0xe8,0xf0,0xe0,
         0x80,0xc0,0x40,0,0,0xe8,0xf0,0x40,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,0xe0,
         0xe0,0x80,0xfc,0x1c,0,0xe0,0,0xe0,0xf8,0xf0);
  vpatch(rom,0x12300,0x80,0xd,0x1f,0x1f,0xc,0xe,10,0x18,0x3c,0xd,0x1f,0x1a,7,0xf,0xf,0x1f,7,0x3f,
         0x1e,0x1f,0xf,0x1f,0x3f,0x3f,0,0x43,0xe1,0xe8,0x67,4,0x3f,0x3f,0x1e,10,0x1f,0xf,0x1c,0x1e,
         10,0x38,0xc,10,0x1f,10,0x17,0x1f,0xf,0x1f,0x77,0x1f,0x1e,0x1f,0xf,0x1f,0x1f,0,0,0xe3,0xe1,
         0x68,7,0x12,0x1f,0xc,0,0xa8,0xf0);
  vpatch(rom,0x12400,0x180,0xd,0x1f,0x3f,0x2c,0x2e,0x2a,0x38,0x3c,0xd,0x1f,0x1a,7,0xf,0xf,0x1f,7,
         0x3f,0x7e,0x1f,0xf,0x1f,0x3f,0x3f,0,0x43,0x71,0x68,0x67,100,0x3f,0x3f,0x1e,0x54,0xf8,0xfc,
         0x3a,0xdc,0x5a,0x38,0x38,0x54,0xf8,0x9c,0xea,0xfc,0xfa,0xf4,0xe6,0xe8,0x60,0xe0,0xf0,0xf8,
         0xf8,0,0,0xd6,0x9e,0x1c,0xe0,0x58,0xf8,0x30,0,0x8a,0x9f);
  vpatch(rom,0x12a20,0x70,0xf,0x8f,0xdf,0xff,0x7f,0x1f,0x1f,0,0x70,0xf0,0xe0,0xff,0x60,0x1f,0x1f,
         0x1e,0xe1,0xe3,0xe0,0xf0,0xf8,0x80,0,0,0x1f,0x1f,0x1e,0xec,0x18,0xb8,0,0,0x2f,0x1f,0x7f,
         0x1f,0x7f,0x1f,0x1f,0x1f,0x2f,0x1f,0x7f,0x1f,0x7f,0x1f,0xf,0x20,0xae,0xff,0xff,0xf3,0xf3,
         0xfd,0xff,0xf3,0xae,0xff,0xff,0xff,0xff,0xf3,0xc9,0xd,7,0x87);
  vpatch(rom,0x12aa0,0x10,0xf,8,0,0xc1,0xe7,0x7f,0x7e,4,0xf7,0xf7,0xff,0xff,0x18,0x7f,0xff,0x67);
  vpatch(rom,0x12ac0,0x10,0xd6,0xff,0xff,0xf3,0xf3,0xfd,0xff,0xf7,0xd6,0xff,0xff,0xff,0xff,0xf3,0xcd
         ,0xf);
  vpatch(rom,0x12ae0,0x10,0x8f,8,0,0x81,199,0x7f,0x7f,0,0x77,0xf7,0xff,0xff,0x38,0x7f,0x7f,0x1e);
  vpatch(rom,0x12b50,0x10,0xaa,0xff,0xff,0xc3,0xed,0xa5,0x83,0xc3,0xaa,0xff,0xa9,0x7e,0xff,0xff,0xff
         ,0x7e);
  vpatch(rom,0x12b80,0x20,0xd5,0xff,0xff,0xc3,0xed,0xa5,0x83,0xc3,0xd5,0xff,0xa9,0x7e,0xff,0xff,0xff
         ,0x7e,0xbf,0xff,0x7f,0xf4,0x96,0xd2,0xf0,0xf8,0xbf,0xff,0x72,0xff,0xff,0xff,0xff,0xf);
  vpatch(rom,0x12bd0,0x10,0xbf,0x7f,0xff,0xf4,0x96,0xd2,0xf0,0xf8,0xbf,0x7f,0xf2,0xff,0xff,0xff,0xff
         ,0x8f);
  return;
}

Assistant:

static void zhangfei(dw_rom *rom)
{
    doae(rom);
    vpatch(rom, 0x01a8e,   3, 0x2b, 0x37, 0x06);
    set_player_palette(rom, 1);
    vpatch(rom, 0x12260,  64, 0xE0, 0xF0, 0xE8, 0x80, 0xC0, 0x40, 0x00, 0x00, 0xE0, 0xF0, 0x48, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0x20, 0x20, 0x20, 0xE0, 0xE0, 0xE0, 0x00, 0xE0, 0xC0, 0xD8, 0xF8, 0x00, 0xE0, 0xE0, 0xC0, 0xE8, 0xF0, 0xE0, 0x80, 0xC0, 0x40, 0x00, 0x00, 0xE8, 0xF0, 0x40, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0x80, 0xFC, 0x1C, 0x00, 0xE0, 0x00, 0xE0, 0xF8, 0xF0);
    vpatch(rom, 0x12300, 128, 0x0D, 0x1F, 0x1F, 0x0C, 0x0E, 0x0A, 0x18, 0x3C, 0x0D, 0x1F, 0x1A, 0x07, 0x0F, 0x0F, 0x1F, 0x07, 0x3F, 0x1E, 0x1F, 0x0F, 0x1F, 0x3F, 0x3F, 0x00, 0x43, 0xE1, 0xE8, 0x67, 0x04, 0x3F, 0x3F, 0x1E, 0x0A, 0x1F, 0x0F, 0x1C, 0x1E, 0x0A, 0x38, 0x0C, 0x0A, 0x1F, 0x0A, 0x17, 0x1F, 0x0F, 0x1F, 0x77, 0x1F, 0x1E, 0x1F, 0x0F, 0x1F, 0x1F, 0x00, 0x00, 0xE3, 0xE1, 0x68, 0x07, 0x12, 0x1F, 0x0C, 0x00, 0xA8, 0xF0, 0xF8, 0xF0, 0xF8, 0xF0, 0xF8, 0xF0, 0xA8, 0xF0, 0xF8, 0xF0, 0xF8, 0xF0, 0xC8, 0x0C, 0xE0, 0xE0, 0xE0, 0xF0, 0xF8, 0x80, 0x00, 0x00, 0x1E, 0x1E, 0x1E, 0xEC, 0x18, 0xB8, 0x00, 0x00, 0xD0, 0xF8, 0xF8, 0xF0, 0xF0, 0xF0, 0xF8, 0xF4, 0xD0, 0xF8, 0xF8, 0xF0, 0xF0, 0xF0, 0xC8, 0x0C, 0xF0, 0xF0, 0xF0, 0xF0, 0xF8, 0xF8, 0xF8, 0x00, 0x0C, 0x0C, 0x08, 0xF0, 0x00, 0xF8, 0xF8, 0x78);
    vpatch(rom, 0x12400, 384, 0x0D, 0x1F, 0x3F, 0x2C, 0x2E, 0x2A, 0x38, 0x3C, 0x0D, 0x1F, 0x1A, 0x07, 0x0F, 0x0F, 0x1F, 0x07, 0x3F, 0x7E, 0x1F, 0x0F, 0x1F, 0x3F, 0x3F, 0x00, 0x43, 0x71, 0x68, 0x67, 0x64, 0x3F, 0x3F, 0x1E, 0x54, 0xF8, 0xFC, 0x3A, 0xDC, 0x5A, 0x38, 0x38, 0x54, 0xF8, 0x9C, 0xEA, 0xFC, 0xFA, 0xF4, 0xE6, 0xE8, 0x60, 0xE0, 0xF0, 0xF8, 0xF8, 0x00, 0x00, 0xD6, 0x9E, 0x1C, 0xE0, 0x58, 0xF8, 0x30, 0x00, 0x8A, 0x9F, 0x8F, 0x9C, 0x9E, 0x8A, 0xB8, 0xDC, 0x0A, 0x1F, 0x0A, 0x17, 0x1F, 0x0F, 0x1F, 0xE7, 0x1F, 0x1E, 0x1F, 0x8F, 0x9F, 0x1F, 0x00, 0x00, 0xE3, 0xE1, 0xC8, 0x87, 0x92, 0x1F, 0x0C, 0x00, 0xA8, 0xFC, 0xFA, 0x3C, 0xDA, 0x5C, 0x3C, 0x3C, 0xA8, 0xFC, 0x9A, 0xEC, 0xFA, 0xFC, 0xF0, 0xE2, 0xF8, 0x78, 0xF8, 0xF0, 0xF8, 0xF8, 0xF8, 0x00, 0xC7, 0x87, 0x13, 0xE6, 0x26, 0xF8, 0xF8, 0x78, 0x2F, 0x1F, 0x7F, 0x1F, 0x7F, 0x1F, 0x1F, 0x1F, 0x2F, 0x1F, 0x7F, 0x1F, 0x7F, 0x1F, 0x0F, 0x20, 0x0F, 0x0F, 0x1F, 0x0F, 0x1F, 0x1F, 0x1F, 0x00, 0x70, 0x70, 0x20, 0x0F, 0x00, 0x1F, 0x1F, 0x1E, 0xA8, 0xF0, 0xFC, 0xF4, 0xFC, 0xF4, 0xFC, 0xF0, 0xA8, 0xF0, 0xF8, 0xF0, 0xF8, 0xF0, 0xC8, 0x0C, 0xE0, 0xE0, 0xE0, 0xF0, 0xF8, 0x80, 0x00, 0x00, 0x1E, 0x1E, 0x1E, 0xEC, 0x18, 0xB8, 0x00, 0x00, 0x0F, 0x3F, 0x3F, 0x5F, 0x3F, 0x5F, 0x1F, 0x0F, 0x0F, 0x3F, 0x3F, 0x5F, 0x3F, 0x5F, 0x0F, 0x30, 0x07, 0x07, 0x07, 0x0F, 0x1F, 0x01, 0x00, 0x00, 0x78, 0x78, 0x78, 0x37, 0x18, 0x1D, 0x00, 0x00, 0xD8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF8, 0xF4, 0xD0, 0xF8, 0xF8, 0xF0, 0xF0, 0xF0, 0xC8, 0x0C, 0xF0, 0xF0, 0xF0, 0xF0, 0xF8, 0xF8, 0xF8, 0x00, 0x0C, 0x0C, 0x08, 0xF0, 0x00, 0xF8, 0xF8, 0x78, 0x2F, 0x1F, 0x9F, 0x7E, 0x12, 0x3A, 0x5E, 0x1F, 0x2F, 0x1F, 0x9E, 0x7F, 0x1F, 0x3F, 0x5F, 0x11, 0x11, 0x01, 0x00, 0x10, 0x18, 0x0F, 0x0F, 0x00, 0x0E, 0x1E, 0x1F, 0x1F, 0x07, 0x0F, 0x0F, 0x03, 0xE0, 0xF0, 0xF8, 0x90, 0xD0, 0x50, 0x10, 0x10, 0xE0, 0xF0, 0x48, 0xE0, 0xE0, 0xE0, 0xE0, 0xE0, 0xF0, 0x38, 0x20, 0x20, 0xF0, 0xE0, 0xE0, 0x00, 0xE0, 0xD8, 0xD8, 0xF8, 0x10, 0xE0, 0xE0, 0xC0, 0x17, 0x1F, 0x5F, 0x3E, 0x12, 0x7A, 0x1E, 0x3F, 0x17, 0x1F, 0x5E, 0x3F, 0x1F, 0x7F, 0x1F, 0x21, 0x03, 0x01, 0x03, 0x1F, 0x0F, 0x1F, 0x1F, 0x00, 0x3C, 0x7E, 0x7C, 0x6F, 0x30, 0x1F, 0x3F, 0x18, 0xE8, 0xF4, 0xE4, 0x84, 0xC4, 0x44, 0x04, 0x0E, 0xE8, 0xF0, 0x40, 0xE0, 0xE0, 0xE0, 0xE0, 0xEE, 0xE0, 0xE0, 0xE4, 0xE0, 0xE0, 0xE0, 0xE0, 0x80, 0xFC, 0x1C, 0x04, 0xE0, 0x00, 0xE0, 0xF8, 0xF0);
    vpatch(rom, 0x12a20, 112, 0x0F, 0x8F, 0xDF, 0xFF, 0x7F, 0x1F, 0x1F, 0x00, 0x70, 0xF0, 0xE0, 0xFF, 0x60, 0x1F, 0x1F, 0x1E, 0xE1, 0xE3, 0xE0, 0xF0, 0xF8, 0x80, 0x00, 0x00, 0x1F, 0x1F, 0x1E, 0xEC, 0x18, 0xB8, 0x00, 0x00, 0x2F, 0x1F, 0x7F, 0x1F, 0x7F, 0x1F, 0x1F, 0x1F, 0x2F, 0x1F, 0x7F, 0x1F, 0x7F, 0x1F, 0x0F, 0x20, 0xAE, 0xFF, 0xFF, 0xF3, 0xF3, 0xFD, 0xFF, 0xF3, 0xAE, 0xFF, 0xFF, 0xFF, 0xFF, 0xF3, 0xC9, 0x0D, 0x07, 0x87, 0x87, 0xCF, 0x7F, 0x01, 0x00, 0x00, 0x78, 0xF8, 0xF8, 0xF7, 0x78, 0x1D, 0x00, 0x00, 0xF3, 0xF3, 0xF4, 0xF0, 0xF8, 0xF8, 0xF8, 0x00, 0x0F, 0x0F, 0x0C, 0xF0, 0x00, 0xF8, 0xF8, 0x78, 0x0F, 0x3F, 0x3F, 0x5F, 0x3F, 0x5F, 0x1F, 0x0F, 0x0F, 0x3F, 0x3F, 0x5F, 0x3F, 0x5F, 0x0F, 0x30);
    vpatch(rom, 0x12aa0,  16, 0x0F, 0x08, 0x00, 0xC1, 0xE7, 0x7F, 0x7E, 0x04, 0xF7, 0xF7, 0xFF, 0xFF, 0x18, 0x7F, 0xFF, 0x67);
    vpatch(rom, 0x12ac0,  16, 0xD6, 0xFF, 0xFF, 0xF3, 0xF3, 0xFD, 0xFF, 0xF7, 0xD6, 0xFF, 0xFF, 0xFF, 0xFF, 0xF3, 0xCD, 0x0F);
    vpatch(rom, 0x12ae0,  16, 0x8F, 0x08, 0x00, 0x81, 0xC7, 0x7F, 0x7F, 0x00, 0x77, 0xF7, 0xFF, 0xFF, 0x38, 0x7F, 0x7F, 0x1E);
    vpatch(rom, 0x12b50,  16, 0xAA, 0xFF, 0xFF, 0xC3, 0xED, 0xA5, 0x83, 0xC3, 0xAA, 0xFF, 0xA9, 0x7E, 0xFF, 0xFF, 0xFF, 0x7E);
    vpatch(rom, 0x12b80,  32, 0xD5, 0xFF, 0xFF, 0xC3, 0xED, 0xA5, 0x83, 0xC3, 0xD5, 0xFF, 0xA9, 0x7E, 0xFF, 0xFF, 0xFF, 0x7E, 0xBF, 0xFF, 0x7F, 0xF4, 0x96, 0xD2, 0xF0, 0xF8, 0xBF, 0xFF, 0x72, 0xFF, 0xFF, 0xFF, 0xFF, 0x0F);
    vpatch(rom, 0x12bd0,  16,0xBF, 0x7F, 0xFF, 0xF4, 0x96, 0xD2, 0xF0, 0xF8, 0xBF, 0x7F, 0xF2, 0xFF, 0xFF, 0xFF, 0xFF, 0x8F);
}